

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O2

void litter(void)

{
  obj *poVar1;
  boolean bVar2;
  int x;
  int iVar3;
  char *pcVar4;
  obj *obj;
  
  poVar1 = invent;
  x = weight_cap();
  while (obj = poVar1, obj != (obj *)0x0) {
    poVar1 = obj->nobj;
    if (obj != uball) {
      iVar3 = rnd(x);
      if (iVar3 <= (int)obj->owt) {
        bVar2 = canletgo(obj,"");
        if (bVar2 != '\0') {
          pcVar4 = aobjnam(obj,"follow");
          pline("Your %s you down the stairs.",pcVar4);
          dropx(obj);
        }
      }
    }
  }
  return;
}

Assistant:

static void litter(void)
{
	struct obj *otmp = invent, *nextobj;
	int capacity = weight_cap();

	while (otmp) {
		nextobj = otmp->nobj;
		if ((otmp != uball) && (rnd(capacity) <= (int)otmp->owt)) {
			if (canletgo(otmp, "")) {
				pline("Your %s you down the stairs.",
				     aobjnam(otmp, "follow"));
				dropx(otmp);
			}
		}
		otmp = nextobj;
	}
}